

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Atoi64(char *zNum,i64 *pNum,int length,u8 enc)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  byte *pbVar8;
  uint uVar9;
  undefined7 in_register_00000009;
  ulong uVar10;
  byte *pbVar11;
  byte *pbVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  bool bVar16;
  
  uVar9 = (uint)CONCAT71(in_register_00000009,enc);
  if (uVar9 == 1) {
    lVar7 = (long)length;
    lVar13 = 1;
    bVar5 = false;
    pbVar11 = (byte *)zNum;
  }
  else {
    uVar10 = (ulong)(3 - uVar9);
    if ((int)(3 - uVar9) < length) {
      uVar10 = (ulong)(int)(3 - uVar9);
      do {
        if (zNum[uVar10] != '\0') {
          bVar5 = true;
          goto LAB_00155a59;
        }
        uVar10 = uVar10 + 2;
      } while ((long)uVar10 < (long)length);
    }
    bVar5 = false;
LAB_00155a59:
    lVar7 = (ulong)enc + (long)(int)uVar10 + -3;
    pbVar11 = (byte *)(zNum + (uVar9 & 1));
    lVar13 = 2;
  }
  pbVar8 = (byte *)(zNum + lVar7);
  bVar3 = true;
  for (; pbVar12 = pbVar11, pbVar11 < pbVar8; pbVar11 = pbVar11 + lVar13) {
    bVar1 = *pbVar11;
    if ((""[bVar1] & 1) == 0) {
      if (bVar1 == 0x2b) {
        pbVar11 = pbVar11 + lVar13;
        pbVar12 = pbVar11;
      }
      else if (bVar1 == 0x2d) {
        pbVar11 = pbVar11 + lVar13;
        bVar3 = false;
        pbVar12 = pbVar11;
      }
      break;
    }
  }
  for (; (pbVar11 < pbVar8 && (*pbVar11 == 0x30)); pbVar11 = pbVar11 + lVar13) {
  }
  if (pbVar11 < pbVar8) {
    lVar14 = 0;
    lVar7 = 0;
    do {
      bVar1 = pbVar11[lVar14];
      bVar15 = (byte)(bVar1 - 0x30) < 10;
      if (!bVar15) break;
      lVar7 = (ulong)bVar1 + lVar7 * 10 + -0x30;
      lVar14 = lVar14 + lVar13;
    } while (pbVar11 + lVar14 < pbVar8);
    uVar9 = (uint)lVar14;
    bVar16 = (ulong)bVar1 == 0;
    if (lVar7 < 0) {
      lVar14 = -0x8000000000000000;
      goto LAB_00155b34;
    }
  }
  else {
    uVar9 = 0;
    bVar16 = true;
    bVar15 = true;
    lVar7 = 0;
  }
  lVar14 = -lVar7;
  if (bVar3) {
    lVar14 = lVar7;
  }
LAB_00155b34:
  *pNum = lVar14;
  iVar6 = 1;
  if (((bool)(bVar16 | bVar15)) &&
     (((uVar9 != 0 || (pbVar12 != pbVar11)) &&
      (uVar4 = (int)lVar13 * 0x13, !bVar5 && uVar9 <= uVar4)))) {
    if (uVar4 <= uVar9) {
      uVar10 = 0;
      pbVar8 = pbVar11;
      do {
        bVar1 = *pbVar8;
        bVar2 = "922337203685477580"[uVar10];
        if (0x10 < uVar10) break;
        uVar10 = uVar10 + 1;
        pbVar8 = pbVar8 + lVar13;
      } while (bVar1 == bVar2);
      if (bVar1 == bVar2) {
        iVar6 = (char)pbVar11[lVar13 * 0x12] + -0x38;
      }
      else {
        iVar6 = ((int)(char)bVar1 - (int)(char)bVar2) * 10;
      }
      if (-1 < iVar6) {
        if (iVar6 != 0) {
          return 1;
        }
        return (uint)bVar3 * 2;
      }
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

SQLITE_PRIVATE int sqlite3Atoi64(const char *zNum, i64 *pNum, int length, u8 enc){
  int incr;
  u64 u = 0;
  int neg = 0; /* assume positive */
  int i;
  int c = 0;
  int nonNum = 0;
  const char *zStart;
  const char *zEnd = zNum + length;
  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    incr = 2;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && zNum[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = zNum+i+enc-3;
    zNum += (enc&1);
  }
  while( zNum<zEnd && sqlite3Isspace(*zNum) ) zNum+=incr;
  if( zNum<zEnd ){
    if( *zNum=='-' ){
      neg = 1;
      zNum+=incr;
    }else if( *zNum=='+' ){
      zNum+=incr;
    }
  }
  zStart = zNum;
  while( zNum<zEnd && zNum[0]=='0' ){ zNum+=incr; } /* Skip leading zeros. */
  for(i=0; &zNum[i]<zEnd && (c=zNum[i])>='0' && c<='9'; i+=incr){
    u = u*10 + c - '0';
  }
  if( u>LARGEST_INT64 ){
    *pNum = SMALLEST_INT64;
  }else if( neg ){
    *pNum = -(i64)u;
  }else{
    *pNum = (i64)u;
  }
  testcase( i==18 );
  testcase( i==19 );
  testcase( i==20 );
  if( (c!=0 && &zNum[i]<zEnd) || (i==0 && zStart==zNum) || i>19*incr || nonNum ){
    /* zNum is empty or contains non-numeric text or is longer
    ** than 19 digits (thus guaranteeing that it is too large) */
    return 1;
  }else if( i<19*incr ){
    /* Less than 19 digits, so we know that it fits in 64 bits */
    assert( u<=LARGEST_INT64 );
    return 0;
  }else{
    /* zNum is a 19-digit numbers.  Compare it against 9223372036854775808. */
    c = compare2pow63(zNum, incr);
    if( c<0 ){
      /* zNum is less than 9223372036854775808 so it fits */
      assert( u<=LARGEST_INT64 );
      return 0;
    }else if( c>0 ){
      /* zNum is greater than 9223372036854775808 so it overflows */
      return 1;
    }else{
      /* zNum is exactly 9223372036854775808.  Fits if negative.  The
      ** special case 2 overflow if positive */
      assert( u-1==LARGEST_INT64 );
      assert( (*pNum)==SMALLEST_INT64 );
      return neg ? 0 : 2;
    }
  }
}